

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImU32 ImHashStr(char *data_p,size_t data_size,ImU32 seed)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  bool bVar6;
  
  uVar2 = ~seed;
  uVar1 = uVar2;
  if (data_size == 0) {
    pcVar5 = data_p + 2;
    do {
      uVar3 = (uint)(byte)pcVar5[-2];
      if (pcVar5[-2] != 0) {
        if (((uVar3 == 0x23) && (pcVar5[-1] == '#')) && (*pcVar5 == '#')) {
          uVar1 = uVar2;
        }
        uVar1 = uVar1 >> 8 ^ GCrc32LookupTable[uVar1 & 0xff ^ uVar3];
      }
      pcVar5 = pcVar5 + 1;
    } while (uVar3 != 0);
  }
  else {
    uVar4 = data_size - 1;
    pcVar5 = data_p + 2;
    do {
      if (((1 < uVar4 && (byte)pcVar5[-2] == 0x23) && (pcVar5[-1] == '#')) && (*pcVar5 == '#')) {
        uVar1 = uVar2;
      }
      uVar1 = uVar1 >> 8 ^ GCrc32LookupTable[uVar1 & 0xff ^ (uint)(byte)pcVar5[-2]];
      pcVar5 = pcVar5 + 1;
      bVar6 = uVar4 != 0;
      uVar4 = uVar4 - 1;
    } while (bVar6);
  }
  return ~uVar1;
}

Assistant:

ImU32 ImHashStr(const char* data_p, size_t data_size, ImU32 seed)
{
    seed = ~seed;
    ImU32 crc = seed;
    const unsigned char* data = (const unsigned char*)data_p;
    const ImU32* crc32_lut = GCrc32LookupTable;
    if (data_size != 0)
    {
        while (data_size-- != 0)
        {
            unsigned char c = *data++;
            if (c == '#' && data_size >= 2 && data[0] == '#' && data[1] == '#')
                crc = seed;
            crc = (crc >> 8) ^ crc32_lut[(crc & 0xFF) ^ c];
        }
    }
    else
    {
        while (unsigned char c = *data++)
        {
            if (c == '#' && data[0] == '#' && data[1] == '#')
                crc = seed;
            crc = (crc >> 8) ^ crc32_lut[(crc & 0xFF) ^ c];
        }
    }
    return ~crc;
}